

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool Args::details::isCorrectFlag(String *flag)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong in_RDI;
  allocator local_11;
  ulong local_10;
  
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::length(), uVar2 < 2)) {
    if ((isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&isCorrectFlag(std::__cxx11::string_const&)::
                                     availableSymbols_abi_cxx11_), iVar1 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                 "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ",&local_11);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_);
    }
    lVar3 = std::__cxx11::string::find
                      ((string *)
                       isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                       local_10);
    return lVar3 != -1;
  }
  return false;
}

Assistant:

static inline bool
isCorrectFlag( const String & flag )
{
	if( flag.empty() || flag.length() > 1 )
		return false;

	static const String availableSymbols( SL( "0123456789"
		"abcdefghijklmnopqrstuvwxyz"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ" ) );

	return ( availableSymbols.find( flag ) != String::npos );
}